

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifft.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  ostringstream *this;
  char *pcVar6;
  allocator local_449;
  int fft_length;
  uint local_444;
  string local_440;
  ulong local_420;
  InverseFastFourierTransform inverse_fast_fourier_transform;
  vector<double,_std::allocator<double>_> real;
  vector<double,_std::allocator<double>_> imag;
  ostringstream error_message_5;
  ifstream ifs;
  byte abStack_218 [488];
  
  fft_length = 0x100;
  local_420 = 0;
  local_444 = 0;
LAB_001025f4:
  iVar4 = ya_getopt_long(argc,argv,"l:q:o:h",(option *)0x0,(int *)0x0);
  uVar1 = local_420;
  switch(iVar4) {
  case 0x68:
    anon_unknown.dwarf_2afb::PrintUsage((ostream *)&std::cout);
    return 0;
  case 0x6c:
    goto switchD_00102619_caseD_6c;
  case 0x6f:
    break;
  case 0x71:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
    bVar2 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&inverse_fast_fourier_transform);
    if (bVar2) {
      bVar2 = sptk::IsInRange((uint)inverse_fast_fourier_transform._vptr_InverseFastFourierTransform
                              ,0,2);
      std::__cxx11::string::~string((string *)&ifs);
      if (bVar2) {
        local_444 = (uint)inverse_fast_fourier_transform._vptr_InverseFastFourierTransform;
        goto LAB_001025f4;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&ifs);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -q option must be an integer ");
    poVar5 = std::operator<<(poVar5,"in the range of ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
    poVar5 = std::operator<<(poVar5," to ");
    std::ostream::operator<<((ostream *)poVar5,2);
    std::__cxx11::string::string((string *)&error_message_5,"ifft",(allocator *)&local_440);
    sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
    goto LAB_001027ea;
  default:
    if (iVar4 == -1) {
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string
                  ((string *)&error_message_5,"ifft",(allocator *)&inverse_fast_fourier_transform);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_001027ea;
      }
      if (argc == ya_optind) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      this = (ostringstream *)&ifs;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(this);
        std::operator<<((ostream *)this,"Cannot set translation mode");
        std::__cxx11::string::string
                  ((string *)&error_message_5,"ifft",(allocator *)&inverse_fast_fourier_transform);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_001027ea;
      }
      std::ifstream::ifstream(this);
      if ((pcVar6 != (char *)0x0) &&
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar6),
         (abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        poVar5 = std::operator<<((ostream *)&error_message_5,"Cannot open file ");
        std::operator<<(poVar5,pcVar6);
        std::__cxx11::string::string
                  ((string *)&inverse_fast_fourier_transform,"ifft",(allocator *)&local_440);
        sptk::PrintErrorMessage((string *)&inverse_fast_fourier_transform,&error_message_5);
        std::__cxx11::string::~string((string *)&inverse_fast_fourier_transform);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
        iVar4 = 1;
        goto LAB_00102d16;
      }
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        this = (ostringstream *)&std::cin;
      }
      sptk::InverseFastFourierTransform::InverseFastFourierTransform
                (&inverse_fast_fourier_transform,fft_length);
      if (inverse_fast_fourier_transform.fast_fourier_transform_.is_valid_ == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        std::operator<<((ostream *)&error_message_5,"FFT length must be a power of 2");
        std::__cxx11::string::string((string *)&local_440,"ifft",(allocator *)&real);
        sptk::PrintErrorMessage(&local_440,&error_message_5);
        std::__cxx11::string::~string((string *)&local_440);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
        iVar4 = 1;
        goto LAB_00102d0c;
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&real,(long)fft_length,(allocator_type *)&error_message_5);
      std::vector<double,_std::allocator<double>_>::vector
                (&imag,(long)fft_length,(allocator_type *)&error_message_5);
      goto LAB_001029b5;
    }
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x70:
    anon_unknown.dwarf_2afb::PrintUsage((ostream *)&std::cerr);
    return 1;
  }
  std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
  bVar2 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&inverse_fast_fourier_transform);
  if (bVar2) {
    bVar2 = sptk::IsInRange((uint)inverse_fast_fourier_transform._vptr_InverseFastFourierTransform,0
                            ,2);
    std::__cxx11::string::~string((string *)&ifs);
    if (bVar2) {
      local_420 = (ulong)(uint)inverse_fast_fourier_transform._vptr_InverseFastFourierTransform;
      goto LAB_001025f4;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&ifs);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -o option must be an integer ");
  poVar5 = std::operator<<(poVar5,"in the range of ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
  poVar5 = std::operator<<(poVar5," to ");
  std::ostream::operator<<((ostream *)poVar5,2);
  std::__cxx11::string::string((string *)&error_message_5,"ifft",(allocator *)&local_440);
  sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
  goto LAB_001027ea;
switchD_00102619_caseD_6c:
  std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
  bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&fft_length);
  std::__cxx11::string::~string((string *)&ifs);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"The argument for the -l option must be an integer");
    std::__cxx11::string::string
              ((string *)&error_message_5,"ifft",(allocator *)&inverse_fast_fourier_transform);
    sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
LAB_001027ea:
    std::__cxx11::string::~string((string *)&error_message_5);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
    return 1;
  }
  goto LAB_001025f4;
  while( true ) {
    bVar2 = sptk::InverseFastFourierTransform::Run(&inverse_fast_fourier_transform,&real,&imag);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      std::operator<<((ostream *)&error_message_5,"Failed to run inverse fast Fourier transform");
      std::__cxx11::string::string((string *)&local_440,"ifft",&local_449);
      sptk::PrintErrorMessage(&local_440,&error_message_5);
      goto LAB_00102cdb;
    }
    if (((uint)uVar1 < 2) &&
       (bVar2 = sptk::WriteStream<double>(0,fft_length,&real,(ostream *)&std::cout,(int *)0x0),
       !bVar2)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      std::operator<<((ostream *)&error_message_5,"Failed to write real parts");
      std::__cxx11::string::string((string *)&local_440,"ifft",&local_449);
      sptk::PrintErrorMessage(&local_440,&error_message_5);
      goto LAB_00102cdb;
    }
    if (((uVar1 & 0xfffffffd) == 0) &&
       (bVar2 = sptk::WriteStream<double>(0,fft_length,&imag,(ostream *)&std::cout,(int *)0x0),
       !bVar2)) break;
LAB_001029b5:
    if (((local_444 < 2) &&
        (bVar2 = sptk::ReadStream<double>(false,0,0,fft_length,&real,(istream *)this,(int *)0x0),
        !bVar2)) ||
       (((local_444 & 0xfffffffd) == 0 &&
        (bVar2 = sptk::ReadStream<double>(false,0,0,fft_length,&imag,(istream *)this,(int *)0x0),
        !bVar2)))) {
      iVar4 = 0;
      goto LAB_00102cf5;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
  std::operator<<((ostream *)&error_message_5,"Failed to write imaginary parts");
  std::__cxx11::string::string((string *)&local_440,"ifft",&local_449);
  sptk::PrintErrorMessage(&local_440,&error_message_5);
LAB_00102cdb:
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
  iVar4 = 1;
LAB_00102cf5:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&imag.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&real.super__Vector_base<double,_std::allocator<double>_>);
LAB_00102d0c:
  sptk::InverseFastFourierTransform::~InverseFastFourierTransform(&inverse_fast_fourier_transform);
LAB_00102d16:
  std::ifstream::~ifstream(&ifs);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:q:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("ifft", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ifft", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ifft", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("ifft", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("ifft", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("ifft", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::InverseFastFourierTransform inverse_fast_fourier_transform(fft_length);
  if (!inverse_fast_fourier_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "FFT length must be a power of 2";
    sptk::PrintErrorMessage("ifft", error_message);
    return 1;
  }

  std::vector<double> real(fft_length);
  std::vector<double> imag(fft_length);

  for (;;) {
    if ((kInputRealAndImagParts == input_format ||
         kInputRealPart == input_format) &&
        !sptk::ReadStream(false, 0, 0, fft_length, &real, &input_stream,
                          NULL)) {
      break;
    }
    if ((kInputRealAndImagParts == input_format ||
         kInputImagPart == input_format) &&
        !sptk::ReadStream(false, 0, 0, fft_length, &imag, &input_stream,
                          NULL)) {
      break;
    }

    if (!inverse_fast_fourier_transform.Run(&real, &imag)) {
      std::ostringstream error_message;
      error_message << "Failed to run inverse fast Fourier transform";
      sptk::PrintErrorMessage("ifft", error_message);
      return 1;
    }

    if ((kOutputRealAndImagParts == output_format ||
         kOutputRealPart == output_format) &&
        !sptk::WriteStream(0, fft_length, real, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write real parts";
      sptk::PrintErrorMessage("ifft", error_message);
      return 1;
    }

    if ((kOutputRealAndImagParts == output_format ||
         kOutputImagPart == output_format) &&
        !sptk::WriteStream(0, fft_length, imag, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write imaginary parts";
      sptk::PrintErrorMessage("ifft", error_message);
      return 1;
    }
  }

  return 0;
}